

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

bool __thiscall QFutureInterfaceBase::isProgressUpdateNeeded(QFutureInterfaceBase *this)

{
  long lVar1;
  bool bVar2;
  qint64 qVar3;
  QMutexLocker<QMutex> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd8;
  byte bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            (in_RDI,(QMutex *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar2 = QElapsedTimer::isValid((QElapsedTimer *)(*(long *)&in_RDI->m_isLocked + 0x28));
  bVar4 = true;
  if (bVar2) {
    qVar3 = QElapsedTimer::elapsed((QElapsedTimer *)CONCAT17(1,in_stack_ffffffffffffffd8));
    bVar4 = 0x28 < qVar3;
  }
  QMutexLocker<QMutex>::~QMutexLocker(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool QFutureInterfaceBase::isProgressUpdateNeeded() const
{
    QMutexLocker locker(&d->m_mutex);
    return !d->progressTime.isValid() || (d->progressTime.elapsed() > (1000 / MaxProgressEmitsPerSecond));
}